

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.H
# Opt level: O1

void __thiscall
amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>::GShopLevel
          (GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_> *this,
          IndexSpace *is,int param_2,int max_grid_size,int param_4,Geometry *geom,
          GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_> *fineLevel)

{
  undefined8 uVar1;
  undefined8 uVar2;
  element_type *peVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  IntVect ngrow;
  Level LStack_1af8;
  
  Level::Level(&this->super_Level,is,geom);
  if ((fineLevel->super_Level).m_allregular == true) {
    (this->super_Level).m_allregular = true;
    (this->super_Level).m_ok = true;
  }
  else {
    bVar5 = BoxArray::coarsenable(&(fineLevel->super_Level).m_grids,2,8);
    if (bVar5) {
      peVar3 = (fineLevel->super_Level).m_covered_grids.m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start ==
          *(pointer *)
           ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data + 8)) {
        bVar5 = true;
      }
      else {
        bVar5 = BoxArray::coarsenable(&(fineLevel->super_Level).m_covered_grids,2,1);
      }
    }
    else {
      bVar5 = false;
    }
    uVar4 = *(ulong *)(fineLevel->super_Level).m_ngrow.vect;
    if ((int)uVar4 < 0) {
      uVar9 = (int)uVar4 + 1;
      uVar6 = -uVar9;
      if (0 < (int)uVar9) {
        uVar6 = uVar9;
      }
      uVar6 = ~(uVar6 >> 1);
    }
    else {
      uVar6 = (uint)(uVar4 >> 1) & 0x7fffffff;
    }
    uVar9 = (fineLevel->super_Level).m_ngrow.vect[2];
    uVar8 = (uint)(uVar4 >> 0x20);
    if ((long)uVar4 < 0) {
      uVar8 = uVar8 + 1;
      uVar7 = -uVar8;
      if (0 < (int)uVar8) {
        uVar7 = uVar8;
      }
      uVar8 = ~(uVar7 >> 1);
    }
    else {
      uVar8 = uVar8 >> 1;
    }
    if ((int)uVar9 < 0) {
      uVar9 = uVar9 + 1;
      uVar7 = -uVar9;
      if (0 < (int)uVar9) {
        uVar7 = uVar9;
      }
      uVar9 = ~(uVar7 >> 1);
    }
    else {
      uVar9 = uVar9 >> 1;
    }
    *(ulong *)(this->super_Level).m_ngrow.vect = CONCAT44(uVar8,uVar6);
    (this->super_Level).m_ngrow.vect[2] = uVar9;
    if ((uVar6 * 2 != (fineLevel->super_Level).m_ngrow.vect[0]) ||
       (uVar1 = *(undefined8 *)((this->super_Level).m_ngrow.vect + 1),
       uVar2 = *(undefined8 *)((fineLevel->super_Level).m_ngrow.vect + 1),
       iVar11 = -(uint)((int)uVar2 == (int)uVar1 * 2),
       iVar12 = -(uint)((int)((ulong)uVar2 >> 0x20) == (int)((ulong)uVar1 >> 0x20) * 2),
       auVar10._4_4_ = iVar11, auVar10._0_4_ = iVar11, auVar10._8_4_ = iVar12,
       auVar10._12_4_ = iVar12, iVar11 = movmskpd(uVar6 * 2,auVar10), iVar11 != 3)) {
      (this->super_Level).m_ngrow.vect[0] = 0;
      (this->super_Level).m_ngrow.vect[1] = 0;
      (this->super_Level).m_ngrow.vect[2] = 0;
    }
    if (bVar5 == false) {
      Level::Level(&LStack_1af8,is,(Geometry *)fineLevel);
      ngrow.vect._0_8_ =
           (ulong)(uint)(this->super_Level).m_ngrow.vect[1] << 0x21 |
           (ulong)(uint)((this->super_Level).m_ngrow.vect[0] * 2);
      ngrow.vect[2] = (this->super_Level).m_ngrow.vect[2] * 2;
      Level::prepareForCoarsening(&LStack_1af8,&fineLevel->super_Level,max_grid_size,ngrow);
      iVar11 = Level::coarsenFromFine(&this->super_Level,&LStack_1af8,false);
      (this->super_Level).m_ok = iVar11 == 0;
      Level::~Level(&LStack_1af8);
    }
    else {
      iVar11 = Level::coarsenFromFine(&this->super_Level,&fineLevel->super_Level,true);
      (this->super_Level).m_ok = iVar11 == 0;
    }
  }
  return;
}

Assistant:

GShopLevel<G>::GShopLevel (IndexSpace const* is, int /*ilev*/, int max_grid_size, int /*ngrow*/,
                           const Geometry& geom, GShopLevel<G>& fineLevel)
    : Level(is, geom)
{
    if (fineLevel.isAllRegular()) {
        m_allregular = true;
        m_ok = true;
        return;
    }

    BL_PROFILE("EB2::GShopLevel()-coarse");

    const BoxArray& fine_grids = fineLevel.m_grids;
    const BoxArray& fine_covered_grids = fineLevel.m_covered_grids;

    const int coarse_ratio = 2;
    const int min_width = 8;
    bool coarsenable = fine_grids.coarsenable(coarse_ratio, min_width)
        && (fine_covered_grids.empty() || fine_covered_grids.coarsenable(coarse_ratio));

    m_ngrow = amrex::coarsen(fineLevel.m_ngrow,2);
    if (amrex::scale(m_ngrow,2) != fineLevel.m_ngrow) {
        m_ngrow = IntVect::TheZeroVector();
    }

    if (coarsenable)
    {
        int ierr = coarsenFromFine(fineLevel, true);
        m_ok = (ierr == 0);
    }
    else
    {
        Level fine_level_2(is, fineLevel.m_geom);
        fine_level_2.prepareForCoarsening(fineLevel, max_grid_size, amrex::scale(m_ngrow,2));
        int ierr = coarsenFromFine(fine_level_2, false);
        m_ok = (ierr == 0);
    }
}